

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::GetRotationMatrix
          (FBXConverter *this,RotOrder mode,aiVector3D *rotation,aiMatrix4x4 *out)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  bool *pbVar16;
  long lVar17;
  bool *pbVar18;
  aiMatrix4x4t<float> *paVar19;
  bool *pbVar20;
  aiMatrix4x4t<float> *paVar21;
  aiMatrix4x4t<float> *paVar22;
  float fVar23;
  aiMatrix4x4 temp [3];
  aiMatrix4x4t<float> temp_1;
  bool local_14b [3];
  undefined1 local_148 [16];
  aiMatrix4x4t<float> local_138;
  aiMatrix4x4t<float> local_f8;
  aiMatrix4x4t<float> local_b8;
  aiMatrix4x4t<float> local_78;
  
  if (mode == RotOrder_SphericXYZ) {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x516dbb);
    out->a1 = 1.0;
    out->a2 = 0.0;
    out->a3 = 0.0;
    out->a4 = 0.0;
    out->b1 = 0.0;
    out->b2 = 1.0;
    out->b3 = 0.0;
    out->b4 = 0.0;
    out->c1 = 0.0;
    out->c2 = 0.0;
    out->c3 = 1.0;
    out->c4 = 0.0;
    out->d1 = 0.0;
    out->d2 = 0.0;
    out->d3 = 0.0;
    out->d4 = 1.0;
    return;
  }
  paVar22 = &local_b8;
  out->a1 = 1.0;
  out->a2 = 0.0;
  out->a3 = 0.0;
  out->a4 = 0.0;
  out->b1 = 0.0;
  out->b2 = 1.0;
  out->b3 = 0.0;
  out->b4 = 0.0;
  out->c1 = 0.0;
  out->c2 = 0.0;
  out->c3 = 1.0;
  out->c4 = 0.0;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  local_14b[2] = true;
  local_14b[1] = true;
  local_14b[0] = true;
  lVar17 = 0;
  do {
    *(undefined4 *)((long)&local_138.a1 + lVar17) = 0x3f800000;
    *(undefined8 *)((long)&local_138.a2 + lVar17) = 0;
    *(undefined8 *)((long)&local_138.a4 + lVar17) = 0;
    *(undefined4 *)((long)&local_138.b2 + lVar17) = 0x3f800000;
    *(undefined8 *)((long)&local_138.b3 + lVar17) = 0;
    *(undefined8 *)((long)&local_138.c1 + lVar17) = 0;
    *(undefined4 *)((long)&local_138.c3 + lVar17) = 0x3f800000;
    *(undefined8 *)((long)&local_138.c4 + lVar17) = 0;
    *(undefined8 *)((long)&local_138.d2 + lVar17) = 0;
    *(undefined4 *)((long)&local_138.d4 + lVar17) = 0x3f800000;
    lVar17 = lVar17 + 0x40;
  } while (lVar17 != 0xc0);
  bVar1 = 1.1920929e-07 < ABS(rotation->z);
  if (bVar1) {
    local_b8.a3 = 0.0;
    local_b8.a4 = 0.0;
    fVar23 = rotation->z * 0.017453292;
    local_148 = ZEXT416((uint)fVar23);
    local_b8.b3 = 0.0;
    local_b8.b4 = 0.0;
    local_b8.c1 = 0.0;
    local_b8.c2 = 0.0;
    local_b8.c3 = 1.0;
    local_b8.c4 = 0.0;
    local_b8.d1 = 0.0;
    local_b8.d2 = 0.0;
    local_b8.d3 = 0.0;
    local_b8.d4 = 1.0;
    local_b8.a1 = cosf(fVar23);
    local_b8.b2 = local_b8.a1;
    local_b8.b1 = sinf((float)local_148._0_4_);
    local_b8.a2 = -local_b8.b1;
    local_14b[0] = false;
  }
  local_14b[0] = !bVar1;
  if (1.1920929e-07 < ABS(rotation->y)) {
    fVar23 = rotation->y * 0.017453292;
    local_148 = ZEXT416((uint)fVar23);
    local_f8.a2 = 0.0;
    local_f8.a3 = 0.0;
    local_f8.a4 = 0.0;
    local_f8.b1 = 0.0;
    local_f8.b2 = 1.0;
    local_f8.b3 = 0.0;
    local_f8.b4 = 0.0;
    local_f8.c1 = 0.0;
    local_f8.c2 = 0.0;
    local_f8.c4 = 0.0;
    local_f8.d1 = 0.0;
    local_f8.d2 = 0.0;
    local_f8.d3 = 0.0;
    local_f8.d4 = 1.0;
    local_f8.a1 = cosf(fVar23);
    local_f8.c3 = local_f8.a1;
    fVar23 = sinf((float)local_148._0_4_);
    local_f8.a3 = fVar23;
    local_f8._32_8_ = CONCAT44(local_f8.c2,fVar23) ^ 0x80000000;
    local_14b[1] = false;
  }
  if (1.1920929e-07 < ABS(rotation->x)) {
    local_138.a1 = 1.0;
    local_138.a2 = 0.0;
    local_138.a3 = 0.0;
    local_138.a4 = 0.0;
    local_138.b1 = 0.0;
    local_138.b4 = 0.0;
    local_138.c1 = 0.0;
    fVar23 = rotation->x * 0.017453292;
    local_148 = ZEXT416((uint)fVar23);
    local_138.c4 = 0.0;
    local_138.d1 = 0.0;
    local_138.d2 = 0.0;
    local_138.d3 = 0.0;
    local_138.d4 = 1.0;
    local_138.b2 = cosf(fVar23);
    local_138.c3 = local_138.b2;
    local_138.c2 = sinf((float)local_148._0_4_);
    local_138.b3 = -local_138.c2;
    local_14b[2] = false;
  }
  paVar19 = paVar22;
  paVar21 = paVar22;
  switch(mode) {
  case RotOrder_EulerXYZ:
    pbVar16 = local_14b;
    pbVar20 = local_14b + 2;
    paVar21 = &local_138;
    break;
  case RotOrder_EulerXZY:
    pbVar18 = local_14b;
    pbVar20 = local_14b + 2;
    paVar21 = &local_138;
    goto LAB_0051706a;
  case RotOrder_EulerYZX:
    pbVar16 = local_14b + 2;
    paVar22 = &local_138;
    pbVar18 = local_14b;
    goto LAB_00517049;
  case RotOrder_EulerYXZ:
    pbVar16 = local_14b;
    pbVar18 = local_14b + 2;
    paVar19 = &local_138;
LAB_00517049:
    pbVar20 = local_14b + 1;
    paVar21 = &local_f8;
    goto LAB_00517089;
  case RotOrder_EulerZXY:
    pbVar18 = local_14b + 2;
    pbVar20 = local_14b;
    paVar19 = &local_138;
LAB_0051706a:
    pbVar16 = local_14b + 1;
    paVar22 = &local_f8;
    goto LAB_00517089;
  case RotOrder_EulerZYX:
    pbVar16 = local_14b + 2;
    pbVar20 = local_14b;
    paVar22 = &local_138;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x286,
                  "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                 );
  }
  pbVar18 = local_14b + 1;
  paVar19 = &local_f8;
LAB_00517089:
  if (*pbVar16 == false) {
    fVar12 = paVar22->a1;
    fVar13 = paVar22->a2;
    fVar14 = paVar22->a3;
    fVar15 = paVar22->a4;
    fVar8 = paVar22->b1;
    fVar9 = paVar22->b2;
    fVar10 = paVar22->b3;
    fVar11 = paVar22->b4;
    fVar4 = paVar22->c1;
    fVar5 = paVar22->c2;
    fVar6 = paVar22->c3;
    fVar7 = paVar22->c4;
    fVar23 = paVar22->d2;
    fVar2 = paVar22->d3;
    fVar3 = paVar22->d4;
    out->d1 = paVar22->d1;
    out->d2 = fVar23;
    out->d3 = fVar2;
    out->d4 = fVar3;
    out->c1 = fVar4;
    out->c2 = fVar5;
    out->c3 = fVar6;
    out->c4 = fVar7;
    out->b1 = fVar8;
    out->b2 = fVar9;
    out->b3 = fVar10;
    out->b4 = fVar11;
    out->a1 = fVar12;
    out->a2 = fVar13;
    out->a3 = fVar14;
    out->a4 = fVar15;
  }
  if (*pbVar18 == false) {
    local_78.a1 = out->a1;
    local_78.a2 = out->a2;
    local_78.a3 = out->a3;
    local_78.a4 = out->a4;
    local_78.b1 = out->b1;
    local_78.b2 = out->b2;
    local_78.b3 = out->b3;
    local_78.b4 = out->b4;
    local_78.c1 = out->c1;
    local_78.c2 = out->c2;
    local_78.c3 = out->c3;
    local_78.c4 = out->c4;
    local_78.d1 = out->d1;
    local_78.d2 = out->d2;
    local_78.d3 = out->d3;
    local_78.d4 = out->d4;
    aiMatrix4x4t<float>::operator*=(&local_78,paVar19);
    out->a1 = local_78.a1;
    out->a2 = local_78.a2;
    out->a3 = local_78.a3;
    out->a4 = local_78.a4;
    out->b1 = local_78.b1;
    out->b2 = local_78.b2;
    out->b3 = local_78.b3;
    out->b4 = local_78.b4;
    out->c1 = local_78.c1;
    out->c2 = local_78.c2;
    out->c3 = local_78.c3;
    out->c4 = local_78.c4;
    out->d1 = local_78.d1;
    out->d2 = local_78.d2;
    out->d3 = local_78.d3;
    out->d4 = local_78.d4;
  }
  if (*pbVar20 == false) {
    local_78.a1 = out->a1;
    local_78.a2 = out->a2;
    local_78.a3 = out->a3;
    local_78.a4 = out->a4;
    local_78.b1 = out->b1;
    local_78.b2 = out->b2;
    local_78.b3 = out->b3;
    local_78.b4 = out->b4;
    local_78.c1 = out->c1;
    local_78.c2 = out->c2;
    local_78.c3 = out->c3;
    local_78.c4 = out->c4;
    local_78.d1 = out->d1;
    local_78.d2 = out->d2;
    local_78.d3 = out->d3;
    local_78.d4 = out->d4;
    aiMatrix4x4t<float>::operator*=(&local_78,paVar21);
    out->a1 = local_78.a1;
    out->a2 = local_78.a2;
    out->a3 = local_78.a3;
    out->a4 = local_78.a4;
    out->b1 = local_78.b1;
    out->b2 = local_78.b2;
    out->b3 = local_78.b3;
    out->b4 = local_78.b4;
    out->c1 = local_78.c1;
    out->c2 = local_78.c2;
    out->c3 = local_78.c3;
    out->c4 = local_78.c4;
    out->d1 = local_78.d1;
    out->d2 = local_78.d2;
    out->d3 = local_78.d3;
    out->d4 = local_78.d4;
  }
  return;
}

Assistant:

void FBXConverter::GetRotationMatrix(Model::RotOrder mode, const aiVector3D& rotation, aiMatrix4x4& out)
        {
            if (mode == Model::RotOrder_SphericXYZ) {
                FBXImporter::LogError("Unsupported RotationMode: SphericXYZ");
                out = aiMatrix4x4();
                return;
            }

            const float angle_epsilon = Math::getEpsilon<float>();

            out = aiMatrix4x4();

            bool is_id[3] = { true, true, true };

            aiMatrix4x4 temp[3];
            if (std::fabs(rotation.z) > angle_epsilon) {
                aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(rotation.z), temp[2]);
                is_id[2] = false;
            }
            if (std::fabs(rotation.y) > angle_epsilon) {
                aiMatrix4x4::RotationY(AI_DEG_TO_RAD(rotation.y), temp[1]);
                is_id[1] = false;
            }
            if (std::fabs(rotation.x) > angle_epsilon) {
                aiMatrix4x4::RotationX(AI_DEG_TO_RAD(rotation.x), temp[0]);
                is_id[0] = false;
            }

            int order[3] = { -1, -1, -1 };

            // note: rotation order is inverted since we're left multiplying as is usual in assimp
            switch (mode)
            {
            case Model::RotOrder_EulerXYZ:
                order[0] = 2;
                order[1] = 1;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerXZY:
                order[0] = 1;
                order[1] = 2;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerYZX:
                order[0] = 0;
                order[1] = 2;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerYXZ:
                order[0] = 2;
                order[1] = 0;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerZXY:
                order[0] = 1;
                order[1] = 0;
                order[2] = 2;
                break;

            case Model::RotOrder_EulerZYX:
                order[0] = 0;
                order[1] = 1;
                order[2] = 2;
                break;

            default:
                ai_assert(false);
                break;
            }

            ai_assert(order[0] >= 0);
            ai_assert(order[0] <= 2);
            ai_assert(order[1] >= 0);
            ai_assert(order[1] <= 2);
            ai_assert(order[2] >= 0);
            ai_assert(order[2] <= 2);

            if (!is_id[order[0]]) {
                out = temp[order[0]];
            }

            if (!is_id[order[1]]) {
                out = out * temp[order[1]];
            }

            if (!is_id[order[2]]) {
                out = out * temp[order[2]];
            }
        }